

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldDefault_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  _anonymous_namespace_ _Var1;
  byte bVar2;
  long lVar3;
  EnumValueDescriptor *pEVar4;
  LogMessage *pLVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long *plVar8;
  ushort uVar9;
  size_type *psVar10;
  ushort uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ushort uVar13;
  protobuf *this_00;
  char *pcVar14;
  char cVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  string out;
  string result;
  string local_98;
  LogFinisher local_71;
  undefined1 local_70 [56];
  string *local_38;
  
  if (*(int *)(this + 0x3c) == 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x39c613;
    pcVar14 = (char *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x39c611;
    goto LAB_00248562;
  }
  this_00 = (protobuf *)this;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    this_00 = (protobuf *)local_70;
    local_70._0_8_ = FieldDescriptor::TypeOnceInit;
    local_98._M_dataplus._M_p = (pointer)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)this_00,
               (FieldDescriptor **)&local_98);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4)) {
  case 1:
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70 + 0x10);
    local_70._0_8_ = paVar12;
    local_70._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x90),paVar12->_M_local_buf);
    local_70._8_8_ = local_70._8_8_ + -(long)paVar12;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&local_98);
    break;
  case 2:
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70 + 0x10);
    local_70._0_8_ = paVar12;
    local_70._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x90),paVar12->_M_local_buf);
    local_70._8_8_ = local_70._8_8_ + -(long)paVar12;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&local_98);
    break;
  case 3:
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70 + 0x10);
    local_70._0_8_ = paVar12;
    local_70._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x90),paVar12->_M_local_buf);
    local_70._8_8_ = local_70._8_8_ + -(long)paVar12;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&local_98);
    break;
  case 4:
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70 + 0x10);
    local_70._0_8_ = paVar12;
    local_70._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x90),paVar12->_M_local_buf);
    local_70._8_8_ = local_70._8_8_ + -(long)paVar12;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&local_98);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_((string *)local_70,this_00,*(double *)(this + 0x90));
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::PostProcessFloat(__return_storage_ptr__,&local_98);
    goto LAB_002487e0;
  case 6:
    SimpleFtoa_abi_cxx11_((string *)local_70,this_00,*(float *)(this + 0x90));
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::PostProcessFloat(__return_storage_ptr__,&local_98);
LAB_002487e0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    _Var16._M_p = (pointer)local_70._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_70 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0024878d;
  case 7:
    _Var1 = this[0x90];
    pcVar14 = "false";
    if ((ulong)(byte)_Var1 != 0) {
      pcVar14 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pcVar14 + ((ulong)(byte)_Var1 ^ 5));
    goto LAB_00248562;
  case 8:
    pEVar4 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70 + 0x10);
    local_70._0_8_ = paVar12;
    local_70._8_8_ = FastInt32ToBufferLeft(*(int32 *)(pEVar4 + 0x10),paVar12->_M_local_buf);
    local_70._8_8_ = local_70._8_8_ + -(long)paVar12;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70._8_8_ + local_70._0_8_);
    pcVar14 = (char *)local_70._0_8_;
    goto LAB_00248562;
  case 9:
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_70._0_8_ = FieldDescriptor::TypeOnceInit;
      local_98._M_dataplus._M_p = (pointer)this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_70,
                 (FieldDescriptor **)&local_98);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    cVar15 = (char)&local_98;
    if (*(int *)(this + 0x38) == 9) {
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      plVar8 = *(long **)(this + 0x90);
      uVar20 = plVar8[1];
      bVar21 = uVar20 == 0;
      if (!bVar21) {
        bVar21 = false;
        uVar18 = 0;
        uVar6 = 0;
        do {
          lVar3 = *plVar8;
          if (uVar18 + 1 < uVar20) {
            uVar11 = *(byte *)(lVar3 + uVar18 + 1) & 0x3f;
          }
          else {
            uVar11 = 0;
          }
          if (uVar18 + 2 < uVar20) {
            uVar13 = *(byte *)(lVar3 + uVar18 + 2) & 0x3f;
          }
          else {
            uVar13 = 0;
          }
          uVar20 = uVar20 - uVar18;
          uVar17 = uVar20;
          if (uVar20 == 0) {
LAB_0024895f:
            uVar9 = 0;
          }
          else {
            bVar2 = *(byte *)(lVar3 + uVar18);
            uVar9 = (ushort)bVar2;
            uVar17 = 1;
            if (((((char)bVar2 < '\0') && (uVar17 = 2, (bVar2 & 0xe0) != 0xc0)) &&
                (uVar17 = 3, (bVar2 & 0xf0) != 0xe0)) || (uVar20 < uVar17)) {
              uVar17 = 0;
              goto LAB_0024895f;
            }
            if ((int)uVar17 == 3) {
              uVar9 = uVar13 | uVar11 << 6 | (ushort)bVar2 << 0xc;
            }
            else if ((int)uVar17 == 2) {
              uVar9 = uVar11 | (bVar2 & 0x1f) << 6;
            }
          }
          if (uVar17 != 0) {
            uVar6 = uVar17;
            if (uVar9 < 0x26) {
              switch(uVar9) {
              case 8:
                break;
              case 9:
                break;
              case 10:
                break;
              case 0xb:
switchD_002489ba_caseD_b:
                if ((ushort)(uVar9 - 0x20) < 0x5f) {
                  std::__cxx11::string::push_back(cVar15);
                }
                else {
                  if (uVar9 < 0x100) {
                    StringPrintf_abi_cxx11_((string *)local_70,"\\x%02x");
                    std::__cxx11::string::_M_append((char *)&local_98,local_70._0_8_);
                  }
                  else {
                    StringPrintf_abi_cxx11_((string *)local_70,"\\u%04x");
                    std::__cxx11::string::_M_append((char *)&local_98,local_70._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_70 + 0x10)) {
                    operator_delete((void *)local_70._0_8_);
                  }
                }
                goto LAB_00248a7b;
              case 0xc:
                break;
              case 0xd:
                break;
              default:
                if (uVar9 != 0x22) goto switchD_002489ba_caseD_b;
              }
            }
            else if (uVar9 < 0x3d) {
              if (((uVar9 != 0x26) && (uVar9 != 0x27)) && (uVar9 != 0x3c))
              goto switchD_002489ba_caseD_b;
            }
            else if (((uVar9 != 0x3d) && (uVar9 != 0x3e)) && (uVar9 != 0x5c))
            goto switchD_002489ba_caseD_b;
            std::__cxx11::string::append((char *)&local_98);
          }
LAB_00248a7b:
          if (uVar17 == 0) break;
          uVar18 = uVar18 + uVar6;
          uVar20 = plVar8[1];
          bVar21 = uVar18 >= uVar20;
        } while (uVar18 < uVar20);
      }
      if (!bVar21) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_70,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                   ,0x356);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_70,"The default value for field ");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,*(string **)(this + 8));
        pLVar5 = internal::LogMessage::operator<<
                           (pLVar5,
                            " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                           );
        internal::LogFinisher::operator=(&local_71,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_70);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "\"",&local_98);
      plVar8 = (long *)std::__cxx11::string::append(local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        lVar3 = plVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      _Var16._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      lVar3 = *(long *)(this + 0x90);
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      local_38 = __return_storage_ptr__;
      if (*(long *)(lVar3 + 8) != 0) {
        lVar19 = 2;
        do {
          std::__cxx11::string::push_back(cVar15);
          std::__cxx11::string::push_back(cVar15);
          std::__cxx11::string::push_back(cVar15);
          std::__cxx11::string::push_back(cVar15);
          uVar20 = lVar19 + 1;
          lVar19 = lVar19 + 3;
        } while (uVar20 < *(ulong *)(lVar3 + 8));
      }
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x399884);
      __return_storage_ptr__ = local_38;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar12) {
        local_70._16_8_ = paVar12->_M_allocated_capacity;
        local_70._24_8_ = puVar7[3];
        local_70._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_70 + 0x10);
      }
      else {
        local_70._16_8_ = paVar12->_M_allocated_capacity;
        local_70._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar7;
      }
      local_70._8_8_ = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append(local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        lVar3 = plVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      _Var16._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return __return_storage_ptr__;
      }
    }
    goto LAB_0024878d;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x39ccfe;
    pcVar14 = (char *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x39ccfa;
    goto LAB_00248562;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x361);
    pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_70,"Shouldn\'t reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x393545;
    pcVar14 = (char *)paVar12;
LAB_00248562:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar14,paVar12);
    return __return_storage_ptr__;
  }
  _Var16._M_p = local_98._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0024878d:
    operator_delete(_Var16._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSFieldDefault(const FieldDescriptor* field) {
  if (field->is_repeated()) {
    return "[]";
  }

  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int32()));
    case FieldDescriptor::CPPTYPE_UINT32:
      // The original codegen is in Java, and Java protobufs store unsigned
      // integer values as signed integer values. In order to exactly match the
      // output, we need to reinterpret as base-2 signed. Ugh.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int32>(field->default_value_uint32())));
    case FieldDescriptor::CPPTYPE_INT64:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int64()));
    case FieldDescriptor::CPPTYPE_UINT64:
      // See above note for uint32 -- reinterpreting as signed.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int64>(field->default_value_uint64())));
    case FieldDescriptor::CPPTYPE_ENUM:
      return StrCat(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return FloatToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return DoubleToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        std::string out;
        bool is_valid = EscapeJSString(field->default_value_string(), &out);
        if (!is_valid) {
          // TODO(b/115551870): Decide whether this should be a hard error.
          GOOGLE_LOG(WARNING) << "The default value for field " << field->full_name()
                       << " was truncated since it contained invalid UTF-8 or"
                          " codepoints outside the basic multilingual plane.";
        }
        return "\"" + out + "\"";
      } else {  // Bytes
        return "\"" + EscapeBase64(field->default_value_string()) + "\"";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";
  }
  GOOGLE_LOG(FATAL) << "Shouldn't reach here.";
  return "";
}